

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

size_t omp_capture_affinity(char *buffer,char *format,size_t buf_size,size_t for_size)

{
  size_t sVar1;
  char *pcVar2;
  int gtid;
  size_t sVar3;
  size_t __n;
  ulong uVar4;
  ConvertedString cformat;
  kmp_str_buf_t capture_buf;
  ConvertedString local_250;
  kmp_str_buf_t local_240;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_global_thread_id();
  local_240.str = local_240.bulk;
  local_240.size = 0x200;
  local_240.used = 0;
  local_240.bulk[0] = '\0';
  ConvertedString::ConvertedString(&local_250,format,for_size);
  sVar3 = __kmp_aux_capture_affinity(gtid,local_250.buf,&local_240);
  pcVar2 = local_240.str;
  if (buf_size != 0 && buffer != (char *)0x0) {
    uVar4 = (ulong)local_240.used;
    sVar1 = buf_size - 1;
    __n = sVar1;
    if (uVar4 < buf_size) {
      __n = uVar4;
    }
    strncpy(buffer,local_240.str,__n);
    if (buf_size < uVar4 || buf_size - uVar4 == 0) {
      buffer[sVar1] = pcVar2[sVar1];
    }
    else {
      memset(buffer + uVar4,0x20,buf_size - uVar4);
    }
  }
  __kmp_str_buf_free(&local_240);
  ___kmp_thread_free(local_250.th,local_250.buf);
  return sVar3;
}

Assistant:

size_t FTN_STDCALL FTN_CAPTURE_AFFINITY(char *buffer, char const *format,
                                        size_t buf_size, size_t for_size) {
#if defined(KMP_STUB)
  return 0;
#else
  int gtid;
  size_t num_required;
  kmp_str_buf_t capture_buf;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  __kmp_str_buf_init(&capture_buf);
  ConvertedString cformat(format, for_size);
  num_required = __kmp_aux_capture_affinity(gtid, cformat.get(), &capture_buf);
  if (buffer && buf_size) {
    __kmp_fortran_strncpy_truncate(buffer, buf_size, capture_buf.str,
                                   capture_buf.used);
  }
  __kmp_str_buf_free(&capture_buf);
  return num_required;
#endif
}